

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

sarimax_object sarimax_init(int p,int d,int q,int P,int D,int Q,int s,int r,int imean,int N)

{
  sarimax_object psVar1;
  int local_30;
  int local_2c;
  int ncxreg;
  int i;
  sarimax_object obj;
  int Q_local;
  int D_local;
  int P_local;
  int q_local;
  int d_local;
  int p_local;
  
  if (P + D + Q == 0) {
    s = 0;
  }
  if ((imean < 0) || (1 < imean)) {
    printf("imean only accepts one of two values - 0 and 1 \n");
    exit(-1);
  }
  if (d + D < 1) {
    if (imean == 0) {
      local_30 = r;
    }
    else {
      local_30 = r + 1;
    }
  }
  else {
    local_30 = r;
  }
  if ((((-1 < p) && (-1 < d)) && (-1 < q)) && (((0 < N && (-1 < P)) && ((-1 < D && (-1 < Q)))))) {
    psVar1 = (sarimax_object)
             malloc((long)(((p + q + P + Q + local_30 + N) - d) - s * D) * 8 + 0xa8 +
                    (long)(p + q + P + Q + local_30) * 8 * (long)(p + q + P + Q + local_30));
    psVar1->p = p;
    psVar1->d = d;
    psVar1->q = q;
    psVar1->N = N;
    psVar1->s = s;
    psVar1->P = P;
    psVar1->D = D;
    psVar1->Q = Q;
    psVar1->Nused = (N - d) - s * D;
    psVar1->M = local_30;
    psVar1->r = r;
    psVar1->retval = 0;
    psVar1->start = 0;
    psVar1->imean = imean;
    for (local_2c = 0;
        local_2c <
        (((p + q + P + Q + local_30 + N) - d) - s * D) +
        (p + q + P + Q + local_30) * (p + q + P + Q + local_30); local_2c = local_2c + 1) {
      *(undefined8 *)(&psVar1[1].N + (long)local_2c * 2) = 0;
    }
    psVar1->phi = (double *)(psVar1 + 1);
    psVar1->theta = (double *)(&psVar1[1].N + (long)p * 2);
    psVar1->PHI = (double *)(&psVar1[1].N + (long)(p + q) * 2);
    psVar1->THETA = (double *)(&psVar1[1].N + (long)(p + q + P) * 2);
    psVar1->exog = (double *)(&psVar1[1].N + (long)(p + q + P + Q) * 2);
    psVar1->res = (double *)(&psVar1[1].N + (long)(p + q + P + Q + local_30) * 2);
    psVar1->vcov = (double *)
                   (&psVar1[1].N + (long)(((p + q + P + Q + local_30 + N) - d) - s * D) * 2);
    psVar1->method = 0;
    psVar1->optmethod = 5;
    psVar1->mean = 0.0;
    psVar1->var = 1.0;
    psVar1->lvcov = (p + q + P + Q + local_30) * (p + q + P + Q + local_30);
    psVar1->ncoeff = p + q + P + Q + local_30;
    return psVar1;
  }
  printf("\n Input Values cannot be Negative. Program Exiting. \n");
  exit(-1);
}

Assistant:

sarimax_object sarimax_init(int p, int d, int q,int P, int D, int Q,int s, int r,int imean, int N) {
	sarimax_object obj = NULL;
	int i,ncxreg;
	if (P + D + Q == 0) {
		s = 0;
	}

	if (imean < 0 || imean > 1) {
		printf("imean only accepts one of two values - 0 and 1 \n");
		exit(-1);
	}

	if (d + D > 0) {
		ncxreg = r;
	}
	else {
		if (imean == 0) {
			ncxreg = r;
		} else {
			ncxreg = 1 + r;
		}
	}
	if (p < 0 || d < 0 || q < 0 || N <= 0 || P < 0 || D < 0 || Q < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}
	/*
	Error Codes
	retval = 0 Input Error
	retval = 1 Probable Success
	retval = 4 Optimization Routine didn't converge
	retval = 7 Exogenous Variables are collinear
	retval = 10 Nonstationary AR part
	retavl = 12 Nonstationary Seasonal AR part
	retval = 15 Optimization Routine Encountered Inf/Nan Values

	*/
	
	obj = (sarimax_object)malloc(sizeof(struct sarimax_set) +
	 sizeof(double)* (p + q + P + Q + ncxreg + N - d - s*D) + sizeof(double)* (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg ));

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->Nused = N - d - s*D;
	obj->M = ncxreg;
	obj->r = r;
	obj->retval = 0;
	obj->start = 0;
	obj->imean = imean;

	for (i = 0; i < (p + q + P + Q + ncxreg + N - d - s*D) + (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg ); ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->PHI = &obj->params[p + q];
	obj->THETA = &obj->params[p + q + P];
	obj->exog = &obj->params[p + q + P + Q];
	obj->res = &obj->params[p + q + P + Q + ncxreg];
	obj->vcov = &obj->params[p + q + P + Q + ncxreg + N - d - s*D];


	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg );
	obj->ncoeff = p + q + P + Q + ncxreg ;

	return obj;
}